

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  int iVar6;
  size_type sVar7;
  pointer pbVar8;
  pointer ppVar9;
  string sStack_a8;
  int iStack_84;
  cmTestGenerator *pcStack_80;
  string sStack_78;
  pointer pbStack_58;
  pointer pbStack_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_48;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  pcVar2 = this->Test;
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sStack_78._M_dataplus._M_p = (pointer)&sStack_78.field_2;
  pcVar3 = (pbVar8->_M_dataplus)._M_p;
  iStack_84 = indent.Level;
  pcStack_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_78,pcVar3,pcVar3 + pbVar8->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_78);
  iVar6 = iStack_84;
  if (0 < iStack_84) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
  sStack_a8._M_dataplus._M_p = (pointer)&sStack_a8.field_2;
  pcVar3 = (pcStack_80->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_a8,pcVar3,pcVar3 + (pcStack_80->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,sStack_a8._M_dataplus._M_p,sStack_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,sStack_78._M_dataplus._M_p,sStack_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_a8._M_dataplus._M_p != &sStack_a8.field_2) {
    operator_delete(sStack_a8._M_dataplus._M_p,sStack_a8.field_2._M_allocated_capacity + 1);
  }
  pbStack_58 = (pcVar2->Command).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar8 + 1 != pbStack_58) {
    pbStack_50 = pbVar8 + 1;
    std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
    sVar4 = pbVar8[1]._M_string_length;
    if (sVar4 != 0) {
      pcVar3 = pbVar8[1]._M_dataplus._M_p;
      sVar7 = 0;
      do {
        cVar1 = pcVar3[sVar7];
        if (cVar1 == '\"') {
          sStack_a8._M_dataplus._M_p._0_1_ = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_a8,1);
        }
        sStack_a8._M_dataplus._M_p._0_1_ = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_a8,1);
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    pbVar8 = pbStack_50;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  cVar1 = (char)os;
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  iVar6 = iStack_84;
  if (0 < iStack_84) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
  sStack_a8._M_dataplus._M_p = (pointer)&sStack_a8.field_2;
  pcVar3 = (pcStack_80->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_a8,pcVar3,pcVar3 + (pcStack_80->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,sStack_a8._M_dataplus._M_p,sStack_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_a8._M_dataplus._M_p != &sStack_a8.field_2) {
    operator_delete(sStack_a8._M_dataplus._M_p,sStack_a8.field_2._M_allocated_capacity + 1);
  }
  cmPropertyMap::GetList_abi_cxx11_(&vStack_48,&pcStack_80->Test->Properties);
  for (ppVar9 = vStack_48.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 != vStack_48.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(ppVar9->first)._M_dataplus._M_p,(ppVar9->first)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    cmOutputConverter::EscapeForCMake(&sStack_a8,&ppVar9->second);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,sStack_a8._M_dataplus._M_p,sStack_a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_a8._M_dataplus._M_p != &sStack_a8.field_2) {
      operator_delete(sStack_a8._M_dataplus._M_p,sStack_a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_48);
  GenerateInternalProperties(pcStack_80,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_78._M_dataplus._M_p != &sStack_78.field_2) {
    operator_delete(sStack_78._M_dataplus._M_p,sStack_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os, Indent indent)
{
  if (this->ActionsPerConfig) {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
  } else {
    // This is an old-style test, so there is only one config.
    // assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
  }
}